

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
::TestBody(SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
           *this)

{
  VTable **ppVVar1;
  int iVar2;
  WrapperMock *this_00;
  bool bVar3;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *impl;
  _Any_data local_130;
  code *local_120;
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
  local_110;
  int *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  TextureId local_e4;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_e0;
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_78;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_60;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_48;
  undefined8 local_30;
  undefined8 local_28;
  
  this_00 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
             rawPointer)->super_WrapperMock;
  local_28 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_110,(PointerMatcher *)&local_28);
  local_30 = 3;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_78,(PointerMatcher *)&local_30);
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::internal::EqMatcher<std::nullopt_t>,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325090;
  local_60.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::internal::EqMatcher<std::nullopt_t>,true>>()
       ::kVTable;
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325090;
  SDL::WrapperMock::gmock_renderCopy
            (&local_e0,this_00,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_110,
             (Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_78,(Matcher<const_std::optional<SDL_Rect>_&> *)&local_48,
             (Matcher<const_std::optional<SDL_Rect>_&> *)&local_60);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x17e,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), Eq(std::nullopt), Eq(std::nullopt))"
                      );
  local_f8 = (int *)operator_new(4);
  *local_f8 = -1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_f0,local_f8);
  impl = (ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032a6d0;
  iVar2 = *local_f8;
  *(int *)&impl[1]._vptr_ActionInterface = iVar2;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar2;
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::Action((Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            *)&local_130,impl);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_01,(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
                      *)&local_130);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)&local_e0.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_false>
              );
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                *)&local_e0.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                   .
                   super__Head_base<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
              );
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase
            ((MatcherBase<const_std::optional<SDL_Rect>_&> *)
             &local_e0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
              .super__Head_base<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase
            ((MatcherBase<const_std::optional<SDL_Rect>_&> *)&local_e0.matchers_);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_60);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_48);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase(&local_78);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_110);
  ppVVar1 = (VTable **)
            ((long)&local_e0.matchers_.
                    super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                    .
                    super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                    .
                    super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                    .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_> + 8)
  ;
  local_e0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.vtable_ = (VTable *)0x0;
  local_e0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.buffer_.ptr = (void *)0x0;
  local_e0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_e0.function_mocker_ =
       (FunctionMocker<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
        *)ppVVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e4.t = (anonymous_namespace)::textureId0;
    SDLGraphicsSystem::renderTextureInFullWindow
              (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
               &local_e4);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_e0,0,
             (char *)local_e0.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                     .
                     super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                     .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
                     super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>
                     ._M_head_impl.super_MatcherBase<const_std::optional<SDL_Rect>_&>.
                     super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,0x28b67e);
  testing::Message::Message((Message *)&local_130);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x180,(char *)local_e0.function_mocker_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_130);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
  if ((long *)local_130._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_130._M_unused._M_object + 8))();
  }
  if (local_e0.function_mocker_ !=
      (FunctionMocker<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
       *)ppVVar1) {
    operator_delete(local_e0.function_mocker_,
                    (ulong)((long)&(local_e0.matchers_.
                                    super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                    .
                                    super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                    .
                                    super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                    .
                                    super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                                    .
                                    super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>
                                    ._M_head_impl.super_MatcherBase<const_std::optional<SDL_Rect>_&>
                                   .vtable_)->match_and_explain + 1));
  }
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(failure));

    EXPECT_THROW(system.renderTextureInFullWindow(textureId0), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}